

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined **local_b8;
  Buffer buffer;
  thread local_40;
  thread producerAThread;
  thread producerBThread;
  thread consumeAThread;
  thread consumeBThread;
  
  local_b8 = &PTR__Buffer_00103d60;
  std::condition_variable::condition_variable((condition_variable *)&buffer);
  buffer.mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  buffer.mutex.super___mutex_base._M_mutex._32_5_ = 0;
  buffer.mutex.super___mutex_base._M_mutex._8_8_ = 0;
  buffer.mutex.super___mutex_base._M_mutex._16_8_ = 0;
  buffer._48_8_ = 0;
  buffer.mutex.super___mutex_base._M_mutex.__align = 0;
  buffer.mutex.super___mutex_base._M_mutex._37_3_ = 0;
  buffer.position = 0;
  buffer.buffer[0] = '\0';
  producerAThread._M_id._M_thread = (id)(id)&local_b8;
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&local_40,produceA,(reference_wrapper<Buffer> *)&producerAThread,
             &PRODUCER_A_SLEEP_IN_SECONDS);
  producerBThread._M_id._M_thread = (id)(id)&local_b8;
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&producerAThread,produceB,(reference_wrapper<Buffer> *)&producerBThread,
             &PRODUCER_B_SLEEP_IN_SECONDS);
  consumeAThread._M_id._M_thread = (id)(id)&local_b8;
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&producerBThread,consumeA,(reference_wrapper<Buffer> *)&consumeAThread,
             &CONSUMER_A_SLEEP_IN_SECONDS);
  buffer._104_8_ = &local_b8;
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&consumeAThread,consumeB,(reference_wrapper<Buffer> *)(buffer.buffer + 4),
             &CONSUMER_B_SLEEP_IN_SECONDS);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  if ((((consumeAThread._M_id._M_thread == 0) && (producerBThread._M_id._M_thread == 0)) &&
      (producerAThread._M_id._M_thread == 0)) && (local_40._M_id._M_thread == 0)) {
    local_b8 = &PTR__Buffer_00103d60;
    std::condition_variable::~condition_variable((condition_variable *)&buffer);
    return 0;
  }
  std::terminate();
}

Assistant:

int main() {
    Buffer buffer;

    auto producerAThread = std::thread(produceA, std::ref(buffer), PRODUCER_A_SLEEP_IN_SECONDS);
    auto producerBThread = std::thread(produceB, std::ref(buffer), PRODUCER_B_SLEEP_IN_SECONDS);
    auto consumeAThread = std::thread(consumeA, std::ref(buffer), CONSUMER_A_SLEEP_IN_SECONDS);
    auto consumeBThread = std::thread(consumeB, std::ref(buffer), CONSUMER_B_SLEEP_IN_SECONDS);

    producerAThread.join();
    producerBThread.join();
    consumeAThread.join();
    consumeBThread.join();
    return 0;
}